

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt * __thiscall llvm::APInt::operator*=(APInt *this,APInt *RHS)

{
  APInt local_20;
  
  if (this->BitWidth == RHS->BitWidth) {
    operator*(&local_20,this);
    operator=(this,&local_20);
    ~APInt(&local_20);
    return this;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xff,"APInt &llvm::APInt::operator*=(const APInt &)");
}

Assistant:

APInt& APInt::operator*=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  *this = *this * RHS;
  return *this;
}